

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

int64_t __thiscall
icu_63::CollationData::getSingleCE(CollationData *this,UChar32 c,UErrorCode *errorCode)

{
  int64_t *piVar1;
  uint32_t *puVar2;
  UBool UVar3;
  int32_t iVar4;
  int64_t iVar5;
  uint32_t local_34;
  CollationData *pCStack_30;
  uint32_t ce32;
  CollationData *d;
  UErrorCode *errorCode_local;
  UChar32 c_local;
  CollationData *this_local;
  
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 != '\0') {
    return 0;
  }
  local_34 = getCE32(this,c);
  pCStack_30 = this;
  if (local_34 == 0xc0) {
    pCStack_30 = this->base;
    local_34 = getCE32(this->base,c);
  }
  do {
    UVar3 = Collation::isSpecialCE32(local_34);
    if (UVar3 == '\0') {
      iVar5 = Collation::ceFromSimpleCE32(local_34);
      return iVar5;
    }
    iVar4 = Collation::tagFromCE32(local_34);
    switch(iVar4) {
    case 0:
    case 3:
      *errorCode = U_INTERNAL_PROGRAM_ERROR;
      return 0;
    case 1:
      iVar5 = Collation::ceFromLongPrimaryCE32(local_34);
      return iVar5;
    case 2:
      iVar5 = Collation::ceFromLongSecondaryCE32(local_34);
      return iVar5;
    case 4:
    case 7:
    case 8:
    case 9:
    case 0xc:
    case 0xd:
      *errorCode = U_UNSUPPORTED_ERROR;
      return 0;
    case 5:
      iVar4 = Collation::lengthFromCE32(local_34);
      if (iVar4 != 1) {
        *errorCode = U_UNSUPPORTED_ERROR;
        return 0;
      }
      puVar2 = pCStack_30->ce32s;
      iVar4 = Collation::indexFromCE32(local_34);
      local_34 = puVar2[iVar4];
      break;
    case 6:
      iVar4 = Collation::lengthFromCE32(local_34);
      if (iVar4 == 1) {
        piVar1 = pCStack_30->ces;
        iVar4 = Collation::indexFromCE32(local_34);
        return piVar1[iVar4];
      }
      *errorCode = U_UNSUPPORTED_ERROR;
      return 0;
    case 10:
      puVar2 = pCStack_30->ce32s;
      iVar4 = Collation::indexFromCE32(local_34);
      local_34 = puVar2[iVar4];
      break;
    case 0xb:
      local_34 = *pCStack_30->ce32s;
      break;
    case 0xe:
      iVar5 = getCEFromOffsetCE32(pCStack_30,c,local_34);
      return iVar5;
    case 0xf:
      iVar5 = Collation::unassignedCEFromCodePoint(c);
      return iVar5;
    }
  } while( true );
}

Assistant:

int64_t
CollationData::getSingleCE(UChar32 c, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    // Keep parallel with CollationDataBuilder::getSingleCE().
    const CollationData *d;
    uint32_t ce32 = getCE32(c);
    if(ce32 == Collation::FALLBACK_CE32) {
        d = base;
        ce32 = base->getCE32(c);
    } else {
        d = this;
    }
    while(Collation::isSpecialCE32(ce32)) {
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::LATIN_EXPANSION_TAG:
        case Collation::BUILDER_DATA_TAG:
        case Collation::PREFIX_TAG:
        case Collation::CONTRACTION_TAG:
        case Collation::HANGUL_TAG:
        case Collation::LEAD_SURROGATE_TAG:
            errorCode = U_UNSUPPORTED_ERROR;
            return 0;
        case Collation::FALLBACK_TAG:
        case Collation::RESERVED_TAG_3:
            errorCode = U_INTERNAL_PROGRAM_ERROR;
            return 0;
        case Collation::LONG_PRIMARY_TAG:
            return Collation::ceFromLongPrimaryCE32(ce32);
        case Collation::LONG_SECONDARY_TAG:
            return Collation::ceFromLongSecondaryCE32(ce32);
        case Collation::EXPANSION32_TAG:
            if(Collation::lengthFromCE32(ce32) == 1) {
                ce32 = d->ce32s[Collation::indexFromCE32(ce32)];
                break;
            } else {
                errorCode = U_UNSUPPORTED_ERROR;
                return 0;
            }
        case Collation::EXPANSION_TAG: {
            if(Collation::lengthFromCE32(ce32) == 1) {
                return d->ces[Collation::indexFromCE32(ce32)];
            } else {
                errorCode = U_UNSUPPORTED_ERROR;
                return 0;
            }
        }
        case Collation::DIGIT_TAG:
            // Fetch the non-numeric-collation CE32 and continue.
            ce32 = d->ce32s[Collation::indexFromCE32(ce32)];
            break;
        case Collation::U0000_TAG:
            U_ASSERT(c == 0);
            // Fetch the normal ce32 for U+0000 and continue.
            ce32 = d->ce32s[0];
            break;
        case Collation::OFFSET_TAG:
            return d->getCEFromOffsetCE32(c, ce32);
        case Collation::IMPLICIT_TAG:
            return Collation::unassignedCEFromCodePoint(c);
        }
    }
    return Collation::ceFromSimpleCE32(ce32);
}